

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_batch * whisper_batch_init(int32_t n_tokens,int32_t n_seq_max)

{
  whisper_token *pwVar1;
  whisper_pos *pwVar2;
  int32_t *piVar3;
  whisper_seq_id **ppwVar4;
  whisper_seq_id *pwVar5;
  int8_t *piVar6;
  int in_EDX;
  int in_ESI;
  whisper_batch *in_RDI;
  whisper_batch *batch;
  int i;
  int local_c;
  
  memset(in_RDI,0,0x30);
  pwVar1 = (whisper_token *)malloc((long)in_ESI << 2);
  in_RDI->token = pwVar1;
  pwVar2 = (whisper_pos *)malloc((long)in_ESI << 2);
  in_RDI->pos = pwVar2;
  piVar3 = (int32_t *)malloc((long)in_ESI << 2);
  in_RDI->n_seq_id = piVar3;
  ppwVar4 = (whisper_seq_id **)malloc((long)(in_ESI + 1) << 3);
  in_RDI->seq_id = ppwVar4;
  for (local_c = 0; local_c < in_ESI; local_c = local_c + 1) {
    pwVar5 = (whisper_seq_id *)malloc((long)in_EDX << 2);
    in_RDI->seq_id[local_c] = pwVar5;
  }
  in_RDI->seq_id[in_ESI] = (whisper_seq_id *)0x0;
  piVar6 = (int8_t *)malloc((long)in_ESI);
  in_RDI->logits = piVar6;
  return in_RDI;
}

Assistant:

static struct whisper_batch whisper_batch_init(int32_t n_tokens, int32_t n_seq_max) {
    whisper_batch batch = { 0, nullptr, nullptr, nullptr, nullptr, nullptr, };

    batch.token    = (whisper_token *  ) malloc(sizeof(whisper_token)    * (n_tokens));
    batch.pos      = (whisper_pos *)     malloc(sizeof(whisper_pos)      * (n_tokens));
    batch.n_seq_id = (int32_t *)         malloc(sizeof(int32_t)          * (n_tokens));
    batch.seq_id   = (whisper_seq_id **) malloc(sizeof(whisper_seq_id *) * (n_tokens + 1));
    for (int i = 0; i < n_tokens; ++i) {
        batch.seq_id[i] = (whisper_seq_id *) malloc(sizeof(whisper_seq_id)   * n_seq_max);
    }
    batch.seq_id[n_tokens] = nullptr;
    batch.logits   = (int8_t *)          malloc(sizeof(int8_t)           * n_tokens);

    return batch;
}